

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int saveip(IP *ip,char *src,int version)

{
  undefined8 uVar1;
  int iVar2;
  uchar uVar3;
  
  if (version == 6) {
    uVar1 = *(undefined8 *)(src + 8);
    *(undefined8 *)&ip->addr = *(undefined8 *)src;
    *(undefined8 *)((long)&ip->addr + 8) = uVar1;
    iVar2 = 0x10;
    uVar3 = '\x06';
  }
  else {
    if (version != 4) {
      return -1;
    }
    (ip->addr).field_0 = (anon_union_4_2_27a871e9_for_ip_0)*(uint32_t *)src;
    *(undefined8 *)&ip[4].addr = 0;
    iVar2 = 4;
    uVar3 = '\x04';
  }
  ip->type = uVar3;
  return iVar2;
}

Assistant:

int saveip(struct IP *ip, const char *src, int version) {
  switch (version) {
  case 4:
    memcpy((void *)ip, src, 4);
    memset((void *)(ip + 4), 0, 8);
    ip->type = 4;
    return 4;
  case 6:
    memcpy((void *)ip, src, 16);
    ip->type = 6;
    return 16;
  default:
    return -1;
  }
}